

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O3

void __thiscall
server::collectservmode::droptokens(collectservmode *this,clientinfo *ci,bool penalty)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  token *ptVar12;
  undefined7 in_register_00000011;
  uint uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  packetbuf p;
  int local_8c;
  packetbuf local_78;
  vec *local_50;
  collectservmode *local_48;
  int local_3c;
  vector<server::collectservmode::token> *local_38;
  
  if (this->notgotbases == false) {
    local_48 = this;
    iVar9 = strcmp(ci->team,"good");
    if (iVar9 == 0) {
      local_8c = 1;
    }
    else {
      iVar9 = strcmp(ci->team,"evil");
      local_8c = (uint)(iVar9 == 0) * 2;
    }
    iVar9 = 0;
    if (!penalty) {
      iVar9 = (ci->state).tokens;
    }
    local_78.super_ucharbuf.buf = (uchar *)0x0;
    local_78.super_ucharbuf.len = 0;
    local_78.super_ucharbuf.maxlen = 0;
    local_78.super_ucharbuf.flags = '\0';
    local_78.growth = 300;
    iVar18 = 0;
    iVar17 = 1;
    local_78.packet = enet_packet_create((void *)0x0,300,1);
    local_78.super_ucharbuf.buf = (local_78.packet)->data;
    local_78.super_ucharbuf.maxlen = (int)(local_78.packet)->dataLength;
    local_38 = &local_48->tokens;
    lVar14 = (long)(local_48->tokens).ulen;
    if (0 < lVar14) {
      local_50 = (vec *)CONCAT44(local_50._4_4_,(int)CONCAT71(in_register_00000011,penalty));
      uVar16 = lVar14 + 1;
      lVar14 = lVar14 * 0x20;
      do {
        ptVar12 = local_38->buf;
        if (*(int *)((long)&ptVar12[-1].dropper + lVar14) == ci->clientnum) {
          if (*(int *)((long)&ptVar12[-1].team + lVar14) == local_8c) {
            iVar7 = iVar9;
            iVar8 = iVar17 + 1;
            iVar3 = iVar17;
          }
          else {
            iVar7 = iVar9 + 1;
            iVar8 = iVar17;
            iVar3 = iVar9;
          }
          iVar17 = iVar8;
          iVar9 = iVar7;
          if (4 < iVar3) {
            if (iVar18 == 0) {
              putint(&local_78,0x6d);
            }
            putint(&local_78,*(int *)((long)&ptVar12[-1].id + lVar14));
            iVar18 = iVar18 + 1;
            ptVar12 = (local_48->tokens).buf;
            iVar3 = (local_48->tokens).ulen;
            uVar10 = iVar3 - 1;
            (local_48->tokens).ulen = uVar10;
            if (1 < iVar3) {
              uVar4 = *(undefined8 *)(ptVar12 + uVar10);
              uVar5 = *(undefined8 *)&ptVar12[uVar10].droptime;
              puVar1 = (undefined8 *)((long)&ptVar12[uVar10].o.field_0 + 4);
              uVar6 = puVar1[1];
              puVar2 = (undefined8 *)((long)&ptVar12[-1].o.field_0 + lVar14 + 4);
              *puVar2 = *puVar1;
              puVar2[1] = uVar6;
              puVar1 = (undefined8 *)((long)&ptVar12[-1].id + lVar14);
              *puVar1 = uVar4;
              puVar1[1] = uVar5;
            }
          }
        }
        uVar16 = uVar16 - 1;
        lVar14 = lVar14 + -0x20;
      } while (1 < uVar16);
      penalty = SUB81(local_50,0);
      if (iVar18 != 0) {
        putint(&local_78,-1);
      }
    }
    putint(&local_78,0x6e);
    putint(&local_78,ci->clientnum);
    putint(&local_78,(int)((ci->state).o.field_0.field_0.x * 16.0));
    putint(&local_78,(int)((ci->state).o.field_0.field_0.y * 16.0));
    putint(&local_78,(int)((ci->state).o.field_0.field_0.z * 16.0));
    uVar10 = 1;
    if (penalty == false) {
      uVar10 = (ci->state).tokens + 1;
    }
    uVar11 = randomMT();
    if (0 < (int)uVar10) {
      local_50 = &(ci->state).o;
      local_3c = -local_8c;
      uVar13 = 0;
      uVar15 = 0;
      do {
        iVar17 = lastmillis;
        iVar9 = ci->clientnum;
        ptVar12 = vector<server::collectservmode::token>::add(local_38);
        iVar18 = local_3c;
        if (uVar15 == 0) {
          iVar18 = local_8c;
        }
        (ptVar12->o).field_0.field_0.z = (local_50->field_0).field_0.z;
        *(undefined8 *)&(ptVar12->o).field_0 = *(undefined8 *)&local_50->field_0;
        ptVar12->team = iVar18;
        ptVar12->droptime = iVar17;
        iVar18 = local_48->nexttoken + 1;
        if (local_48->nexttoken < -1) {
          iVar18 = 1;
        }
        local_48->nexttoken = iVar18;
        ptVar12->id = iVar18;
        ptVar12->dropper = iVar9;
        ptVar12->yaw = uVar13 / uVar10 + (uVar11 & 0xffffff) % 0x168;
        putint(&local_78,iVar18);
        putint(&local_78,ptVar12->team);
        putint(&local_78,ptVar12->yaw);
        uVar15 = uVar15 + 1;
        uVar13 = uVar13 + 0x168;
      } while (uVar10 != uVar15);
    }
    putint(&local_78,-1);
    enet_packet_resize(local_78.packet,(long)local_78.super_ucharbuf.len);
    local_78.super_ucharbuf.buf = (local_78.packet)->data;
    local_78.super_ucharbuf.maxlen = (int)(local_78.packet)->dataLength;
    sendpacket(-1,1,local_78.packet,-1);
    (ci->state).tokens = 0;
    if (((0 < local_78.growth) && (local_78.packet != (ENetPacket *)0x0)) &&
       ((local_78.packet)->referenceCount == 0)) {
      enet_packet_destroy(local_78.packet);
    }
  }
  return;
}

Assistant:

void droptokens(clientinfo *ci, bool penalty = false)
    {
        if(notgotbases) return;
        int team = collectteambase(ci->team), totalenemy = penalty ? 0 : ci->state.tokens, totalfriendly = 1, expired = 0;
        packetbuf p(300, ENET_PACKET_FLAG_RELIABLE);
        loopvrev(tokens)
        {
            token &t = tokens[i];
            if(t.dropper == ci->clientnum && (t.team == team ? ++totalfriendly > TOKENLIMIT : ++totalenemy > TOKENLIMIT))
            {
                if(!expired) putint(p, N_EXPIRETOKENS);
                expired++;
                putint(p, t.id);
                tokens.removeunordered(i);        
            }
        }
        if(expired) putint(p, -1);
        putint(p, N_DROPTOKENS);
        putint(p, ci->clientnum);
        putint(p, int(ci->state.o.x*DMF));
        putint(p, int(ci->state.o.y*DMF));
        putint(p, int(ci->state.o.z*DMF));
        int numdrops = 1 + (penalty ? 0 : ci->state.tokens), yaw = rnd(360);
        loopi(numdrops)
        {
            token &t = droptoken(ci->state.o, yaw + (i*360)/numdrops, !i ? team : -team, lastmillis, ci->clientnum); 
            putint(p, t.id);
            putint(p, t.team);
            putint(p, t.yaw);
        }
        putint(p, -1);
        sendpacket(-1, 1, p.finalize());
        ci->state.tokens = 0;
    }